

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

int EncodeImageNoHuffman
              (VP8LBitWriter *bw,uint32_t *argb,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_array,int width,int height,int quality,int low_effort,
              WebPPicture *pic,int percent_range,int *percent)

{
  uint uVar1;
  int iVar2;
  VP8LHistogramSet *set;
  long lVar3;
  HuffmanTreeToken *tokens;
  uint uVar4;
  HuffmanTreeCode *huffman_code;
  HuffmanTree *huff_tree;
  int cache_bits;
  HuffmanTree *local_c8;
  int local_c0;
  uint32_t histogram_symbols [1];
  HuffmanTreeCode huffman_codes [5];
  
  huffman_codes[4].num_symbols = 0;
  huffman_codes[4]._4_4_ = 0;
  huffman_codes[4].code_lengths = (uint8_t *)0x0;
  huffman_codes[3].code_lengths = (uint8_t *)0x0;
  huffman_codes[3].codes = (uint16_t *)0x0;
  huffman_codes[2].codes = (uint16_t *)0x0;
  huffman_codes[3].num_symbols = 0;
  huffman_codes[3]._4_4_ = 0;
  huffman_codes[2].num_symbols = 0;
  huffman_codes[2]._4_4_ = 0;
  huffman_codes[2].code_lengths = (uint8_t *)0x0;
  huffman_codes[1].code_lengths = (uint8_t *)0x0;
  huffman_codes[1].codes = (uint16_t *)0x0;
  huffman_codes[0].codes = (uint16_t *)0x0;
  huffman_codes[1].num_symbols = 0;
  huffman_codes[1]._4_4_ = 0;
  huffman_codes[0].num_symbols = 0;
  huffman_codes[0]._4_4_ = 0;
  huffman_codes[0].code_lengths = (uint8_t *)0x0;
  huffman_codes[4].codes = (uint16_t *)0x0;
  histogram_symbols[0] = 0;
  cache_bits = 0;
  local_c8 = (HuffmanTree *)WebPSafeMalloc(0x39,0x10);
  if (local_c8 == (HuffmanTree *)0x0) {
    WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    iVar2 = VP8LHashChainFill(hash_chain,quality,argb,width,height,low_effort,pic,percent_range / 2,
                              percent);
    if ((iVar2 != 0) &&
       (local_c0 = width,
       iVar2 = VP8LGetBackwardReferences
                         (width,height,argb,quality,0,3,0,0,hash_chain,refs_array,&cache_bits,pic,
                          percent_range - percent_range / 2,percent), iVar2 != 0)) {
      set = VP8LAllocateHistogramSet(1,cache_bits);
      huff_tree = local_c8;
      if (set == (VP8LHistogramSet *)0x0) {
        WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
        set = (VP8LHistogramSet *)0x0;
      }
      else {
        VP8LHistogramSetClear(set);
        VP8LHistogramStoreRefs(refs_array,*set->histograms);
        iVar2 = GetHuffBitLengthsAndCodes(set,huffman_codes);
        if (iVar2 != 0) {
          iVar2 = bw->used_;
          if (0x1f < iVar2) {
            VP8LPutBitsFlushBits(bw);
            iVar2 = bw->used_;
          }
          bw->used_ = iVar2 + 1;
          lVar3 = 0;
          uVar4 = 0;
          do {
            uVar1 = *(uint *)((long)&huffman_codes[0].num_symbols + lVar3);
            if ((int)uVar1 < (int)uVar4) {
              uVar1 = uVar4;
            }
            uVar4 = uVar1;
            lVar3 = lVar3 + 0x18;
          } while (lVar3 != 0x78);
          tokens = (HuffmanTreeToken *)WebPSafeMalloc((ulong)uVar4,2);
          if (tokens != (HuffmanTreeToken *)0x0) {
            lVar3 = 0;
            do {
              huffman_code = (HuffmanTreeCode *)((long)&huffman_codes[0].num_symbols + lVar3);
              StoreHuffmanCode(bw,huff_tree,tokens,huffman_code);
              ClearHuffmanTreeIfOnlyOneSymbol(huffman_code);
              lVar3 = lVar3 + 0x18;
            } while (lVar3 != 0x78);
            StoreImageToBitMask(bw,local_c0,0,refs_array,histogram_symbols,huffman_codes,pic);
            goto LAB_0013c203;
          }
        }
        WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
      }
      tokens = (HuffmanTreeToken *)0x0;
      goto LAB_0013c203;
    }
  }
  set = (VP8LHistogramSet *)0x0;
  tokens = (HuffmanTreeToken *)0x0;
  huff_tree = local_c8;
LAB_0013c203:
  WebPSafeFree(tokens);
  WebPSafeFree(huff_tree);
  VP8LFreeHistogramSet(set);
  WebPSafeFree(huffman_codes[0].codes);
  return (int)(pic->error_code == VP8_ENC_OK);
}

Assistant:

static int EncodeImageNoHuffman(VP8LBitWriter* const bw,
                                const uint32_t* const argb,
                                VP8LHashChain* const hash_chain,
                                VP8LBackwardRefs* const refs_array, int width,
                                int height, int quality, int low_effort,
                                const WebPPicture* const pic, int percent_range,
                                int* const percent) {
  int i;
  int max_tokens = 0;
  VP8LBackwardRefs* refs;
  HuffmanTreeToken* tokens = NULL;
  HuffmanTreeCode huffman_codes[5] = {{0, NULL, NULL}};
  const uint32_t histogram_symbols[1] = {0};  // only one tree, one symbol
  int cache_bits = 0;
  VP8LHistogramSet* histogram_image = NULL;
  HuffmanTree* const huff_tree = (HuffmanTree*)WebPSafeMalloc(
      3ULL * CODE_LENGTH_CODES, sizeof(*huff_tree));
  if (huff_tree == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Calculate backward references from ARGB image.
  if (!VP8LHashChainFill(hash_chain, quality, argb, width, height, low_effort,
                         pic, percent_range / 2, percent)) {
    goto Error;
  }
  if (!VP8LGetBackwardReferences(width, height, argb, quality, /*low_effort=*/0,
                                 kLZ77Standard | kLZ77RLE, cache_bits,
                                 /*do_no_cache=*/0, hash_chain, refs_array,
                                 &cache_bits, pic,
                                 percent_range - percent_range / 2, percent)) {
    goto Error;
  }
  refs = &refs_array[0];
  histogram_image = VP8LAllocateHistogramSet(1, cache_bits);
  if (histogram_image == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }
  VP8LHistogramSetClear(histogram_image);

  // Build histogram image and symbols from backward references.
  VP8LHistogramStoreRefs(refs, histogram_image->histograms[0]);

  // Create Huffman bit lengths and codes for each histogram image.
  assert(histogram_image->size == 1);
  if (!GetHuffBitLengthsAndCodes(histogram_image, huffman_codes)) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // No color cache, no Huffman image.
  VP8LPutBits(bw, 0, 1);

  // Find maximum number of symbols for the huffman tree-set.
  for (i = 0; i < 5; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[i];
    if (max_tokens < codes->num_symbols) {
      max_tokens = codes->num_symbols;
    }
  }

  tokens = (HuffmanTreeToken*)WebPSafeMalloc(max_tokens, sizeof(*tokens));
  if (tokens == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Store Huffman codes.
  for (i = 0; i < 5; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[i];
    StoreHuffmanCode(bw, huff_tree, tokens, codes);
    ClearHuffmanTreeIfOnlyOneSymbol(codes);
  }

  // Store actual literals.
  if (!StoreImageToBitMask(bw, width, 0, refs, histogram_symbols, huffman_codes,
                           pic)) {
    goto Error;
  }

 Error:
  WebPSafeFree(tokens);
  WebPSafeFree(huff_tree);
  VP8LFreeHistogramSet(histogram_image);
  WebPSafeFree(huffman_codes[0].codes);
  return (pic->error_code == VP8_ENC_OK);
}